

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall BuildTokenTestTwoCommandsInParallel::Run(BuildTokenTestTwoCommandsInParallel *this)

{
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Node *pNVar5;
  size_type sVar6;
  reference pvVar7;
  bool local_fc;
  bool local_fa;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string err;
  int fail_count;
  BuildTokenTestTwoCommandsInParallel *this_local;
  
  iVar3 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions((ManifestParserOptions *)((long)&err.field_2 + 0xc));
  AssertParse(&(this->super_BuildTokenTest).super_BuildTest.super_StateTestWithBuiltinRules.state_,
              "rule token-available\n  command = cat $in > $out\nbuild out1: token-available in1\nbuild out2: token-available in2\nbuild out12: cat out1 out2\n"
              ,stack0xffffffffffffffe4);
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  if (iVar3 != iVar4) {
    testing::Test::AddAssertionFailure(g_current_test);
    return;
  }
  std::__cxx11::string::string((string *)local_40);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"out12",&local_61);
  pNVar5 = Builder::AddTarget(&(this->super_BuildTokenTest).super_BuildTest.builder_,&local_60,
                              (string *)local_40);
  testing::Test::Check
            (pTVar1,pNVar5 != (Node *)0x0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x10b1,"builder_.AddTarget(\"out12\", &err)");
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_40);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                     ,0x10b2,"\"\" == err");
  if (!bVar2) {
    testing::Test::AddAssertionFailure(g_current_test);
    goto LAB_00169647;
  }
  BuildTokenTest::ExpectCanRunMore(&this->super_BuildTokenTest,4,1,1,1,0);
  BuildTokenTest::ExpectAcquireToken(&this->super_BuildTokenTest,3,1,0);
  BuildTokenTest::ExpectWaitForCommand(&this->super_BuildTokenTest,3,1,0);
  pTVar1 = g_current_test;
  bVar2 = Builder::Build(&(this->super_BuildTokenTest).super_BuildTest.builder_,(string *)local_40);
  testing::Test::Check
            (pTVar1,(bool)(~bVar2 & 1),
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x10bd,"builder_.Build(&err)");
  pTVar1 = g_current_test;
  bVar2 = std::operator==("stuck [this is a bug]",
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x10be,"\"stuck [this is a bug]\" == err");
  pTVar1 = g_current_test;
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&(this->super_BuildTokenTest).token_command_runner_.commands_ran_);
  testing::Test::Check
            (pTVar1,sVar6 == 2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x10c0,"2u == token_command_runner_.commands_ran_.size()");
  pTVar1 = g_current_test;
  pvVar7 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&(this->super_BuildTokenTest).token_command_runner_.commands_ran_,0);
  bVar2 = std::operator==(pvVar7,"cat in1 > out1");
  if (bVar2) {
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&(this->super_BuildTokenTest).token_command_runner_.commands_ran_,1);
    bVar2 = std::operator==(pvVar7,"cat in2 > out2");
    local_fa = true;
    if (!bVar2) goto LAB_00169587;
  }
  else {
LAB_00169587:
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&(this->super_BuildTokenTest).token_command_runner_.commands_ran_,0);
    bVar2 = std::operator==(pvVar7,"cat in2 > out2");
    local_fc = false;
    if (bVar2) {
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&(this->super_BuildTokenTest).token_command_runner_.commands_ran_,1);
      local_fc = std::operator==(pvVar7,"cat in1 > out1");
    }
    local_fa = local_fc;
  }
  testing::Test::Check
            (pTVar1,local_fa,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x10c4,
             "(token_command_runner_.commands_ran_[0] == \"cat in1 > out1\" && token_command_runner_.commands_ran_[1] == \"cat in2 > out2\") || (token_command_runner_.commands_ran_[0] == \"cat in2 > out2\" && token_command_runner_.commands_ran_[1] == \"cat in1 > out1\")"
            );
LAB_00169647:
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

TEST_F(BuildTokenTest, TwoCommandsInParallel) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule token-available\n"
"  command = cat $in > $out\n"
"build out1: token-available in1\n"
"build out2: token-available in2\n"
"build out12: cat out1 out2\n"));

  // plan should execute more than one command
  string err;
  EXPECT_TRUE(builder_.AddTarget("out12", &err));
  ASSERT_EQ("", err);

  // 1st command: token available -> allow running
  // 2nd command: no token available but becomes available later
  ExpectCanRunMore(4,     true, true,  true,  false);
  ExpectAcquireToken(3,   true, false, true);
  // 1st call waits for command to finalize or token to become available
  // 2nd call waits for command to finalize
  // 3rd call waits for command to finalize
  ExpectWaitForCommand(3, true, false, false);

  EXPECT_FALSE(builder_.Build(&err));
  EXPECT_EQ("stuck [this is a bug]", err);

  EXPECT_EQ(2u, token_command_runner_.commands_ran_.size());
  EXPECT_TRUE((token_command_runner_.commands_ran_[0] == "cat in1 > out1" &&
               token_command_runner_.commands_ran_[1] == "cat in2 > out2") ||
              (token_command_runner_.commands_ran_[0] == "cat in2 > out2" &&
               token_command_runner_.commands_ran_[1] == "cat in1 > out1"));
}